

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.h
# Opt level: O2

void __thiscall GdlGlyphClassDefn::GdlGlyphClassDefn(GdlGlyphClassDefn *this)

{
  GdlGlyphClassMember::GdlGlyphClassMember(&this->super_GdlGlyphClassMember);
  (this->super_GdlGlyphClassMember).super_GdlDefn._vptr_GdlDefn =
       (_func_int **)&PTR__GdlGlyphClassDefn_00212848;
  (this->m_staName)._M_dataplus._M_p = (pointer)&(this->m_staName).field_2;
  (this->m_staName)._M_string_length = 0;
  (this->m_staName).field_2._M_local_buf[0] = '\0';
  (this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->m_vpglfdMembers).
  super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpglfdMembers).
  super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpglfdMembers).
  super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vlnfMembers).super__Vector_base<GrpLineAndFile,_std::allocator<GrpLineAndFile>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vlnfMembers).super__Vector_base<GrpLineAndFile,_std::allocator<GrpLineAndFile>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vlnfMembers).super__Vector_base<GrpLineAndFile,_std::allocator<GrpLineAndFile>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vpglfaAttrs).
  super__Vector_base<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpglfaAttrs).
  super__Vector_base<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpglfaAttrs).
  super__Vector_base<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vgidFlattened).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vgidFlattened).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vgidFlattened).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->m_vnFsmID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_vnFsmID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_vnFsmID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->m_fReplcmtIn = false;
  this->m_fReplcmtOut = false;
  this->m_nReplcmtInID = -1;
  this->m_nReplcmtOutID = -1;
  this->m_fHasFlatList = false;
  return;
}

Assistant:

GdlGlyphClassDefn()
		: GdlGlyphClassMember()
	{
		
		m_fReplcmtIn = false;
		m_fReplcmtOut = false;
		m_nReplcmtInID = -1;
		m_nReplcmtOutID = -1;
		m_fHasFlatList = false;
	}